

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O1

shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>
chaiscript::dispatch::detail::
call_func<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&),std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&,0ul>
          (element_type *param_1,undefined8 param_2,undefined8 *param_3,undefined8 *param_4,
          Type_Conversions_State *param_5)

{
  code *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> sVar3;
  chaiscript acStack_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  pcVar1 = (code *)*param_3;
  sVar3 = boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
                    (acStack_28,(Boxed_Value *)*param_4,param_5);
  (*pcVar1)(param_1,acStack_28,
            sVar3.
            super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi._M_pi);
  _Var2._M_pi = extraout_RDX;
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  sVar3.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = param_1;
  return (shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>)
         sVar3.
         super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }